

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O0

void sho_obj_return_to_u(obj *obj,schar dx,schar dy)

{
  boolean bVar1;
  int local_20;
  int local_1c;
  int local_18;
  int y;
  int x;
  schar dy_local;
  schar dx_local;
  obj *obj_local;
  
  if ((bhitpos.x != u.ux) || (bhitpos.y != u.uy)) {
    local_18 = (int)bhitpos.x - (int)dx;
    local_1c = (int)bhitpos.y - (int)dy;
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
      local_20 = (int)obj->otyp;
    }
    else {
      local_20 = display_rng(0x219);
      local_20 = local_20 + 1;
    }
    tmp_at(-4,local_20 + 1);
    for (; local_18 != u.ux || local_1c != u.uy; local_18 = local_18 - dx) {
      tmp_at(local_18,local_1c);
      (*windowprocs.win_delay)();
      local_1c = local_1c - dy;
    }
    tmp_at(-6,0);
  }
  return;
}

Assistant:

static void sho_obj_return_to_u(struct obj *obj, schar dx, schar dy)
{
    /* might already be our location (bounced off a wall) */
    if (bhitpos.x != u.ux || bhitpos.y != u.uy) {
	int x = bhitpos.x - dx;
	int y = bhitpos.y - dy;
	
	tmp_at(DISP_OBJECT, dbuf_objid(obj));
	while (x != u.ux || y != u.uy) {
	    tmp_at(x, y);
	    win_delay_output();
	    x -= dx; y -= dy;
	}
	tmp_at(DISP_END, 0);
    }
}